

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeStepToLeaf(RtreeCursor *pCur)

{
  double dVar1;
  char cVar2;
  undefined4 uVar3;
  u8 *puVar4;
  RtreeConstraint *pRVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  i64 iVar10;
  RtreeSearchPoint *pRVar11;
  uint uVar12;
  float fVar13;
  ulong uVar14;
  u8 uVar15;
  long lVar16;
  u8 iLevel;
  int iVar17;
  int iVar18;
  byte bVar19;
  int unaff_R15D;
  double dVar20;
  RtreeDValue RVar21;
  double dVar22;
  int local_ec;
  int local_e8;
  uint local_e4;
  double local_e0;
  RtreeCursor *local_d8;
  int local_cc;
  RtreeNode *local_c8;
  u8 *local_c0;
  int local_b4;
  RtreeSearchPoint *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  RtreeSearchPoint *local_50;
  ulong local_48;
  sqlite3_vtab *local_40;
  long local_38;
  
  local_40 = (pCur->base).pVtab;
  local_ec = 0;
  local_48 = (ulong)(uint)pCur->nConstraint;
  cVar2 = local_40[1].field_0xe;
  local_50 = &pCur->sPoint;
  local_38 = local_48 * 0x18;
  local_d8 = pCur;
  do {
    pRVar11 = local_50;
    if (pCur->bPoint == '\0') {
      if (pCur->nPoint == 0) {
        pRVar11 = (RtreeSearchPoint *)0x0;
      }
      else {
        pRVar11 = pCur->aPoint;
      }
    }
    if ((pRVar11 == (RtreeSearchPoint *)0x0) || (pRVar11->iLevel == '\0')) {
      pCur->atEOF = pRVar11 == (RtreeSearchPoint *)0x0;
      return 0;
    }
    local_c8 = rtreeNodeOfFirstSearchPoint(pCur,&local_ec);
    if (local_ec != 0) {
      return local_ec;
    }
    local_e4 = (uint)(ushort)(*(ushort *)(local_c8->zData + 2) << 8 |
                             *(ushort *)(local_c8->zData + 2) >> 8);
    iVar7 = local_ec;
    do {
      if (local_e4 <= pRVar11->iCell) goto LAB_001e06f4;
      puVar4 = local_c8->zData;
      lVar9 = (ulong)(byte)local_40[1].field_0xf * (ulong)pRVar11->iCell;
      local_c0 = puVar4 + lVar9 + 4;
      if ((int)local_48 < 1) {
        iVar18 = 2;
        dVar22 = -1.0;
      }
      else {
        iVar18 = 2;
        lVar16 = 0;
        dVar22 = -1.0;
        local_b0 = pRVar11;
        iVar17 = unaff_R15D;
        do {
          pRVar5 = pCur->aConstraint;
          iVar8 = *(int *)((long)&pRVar5->op + lVar16);
          if (iVar8 < 0x46) {
            uVar12 = *(int *)((long)&pRVar5->iCoord + lVar16) << 2;
            if (pRVar11->iLevel == '\x01') {
              uVar12 = *(uint *)(puVar4 + (long)(int)uVar12 + lVar9 + 0xc);
              fVar13 = (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                              uVar12 << 0x18);
              if (cVar2 == '\x01') {
                dVar20 = (double)(int)fVar13;
              }
              else {
                dVar20 = (double)fVar13;
              }
              dVar1 = *(double *)((long)&pRVar5->u + lVar16);
              switch(iVar8) {
              case 0x42:
                if (dVar1 < dVar20) {
LAB_001e05d1:
                  iVar18 = 0;
                }
                break;
              case 0x43:
                if (dVar1 <= dVar20) goto LAB_001e05d1;
                break;
              case 0x44:
                if (dVar20 < dVar1) goto LAB_001e05d1;
                break;
              case 0x45:
                if (dVar20 <= dVar1) goto LAB_001e05d1;
                break;
              default:
                if ((dVar20 != dVar1) || (NAN(dVar20) || NAN(dVar1))) goto LAB_001e05d1;
              }
            }
            else {
              uVar14 = (ulong)(uVar12 & 0x3f8);
              if (iVar8 - 0x41U < 3) {
                uVar12 = *(uint *)(local_c0 + uVar14 + 8);
                fVar13 = (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8
                                | uVar12 << 0x18);
                if (cVar2 == '\x01') {
                  dVar20 = (double)(int)fVar13;
                }
                else {
                  dVar20 = (double)fVar13;
                }
                if (dVar20 <= *(double *)((long)&pRVar5->u + lVar16)) goto LAB_001e05d3;
                if (iVar8 != 0x41) goto LAB_001e05d1;
              }
              uVar12 = *(uint *)(local_c0 + uVar14 + 0xc);
              fVar13 = (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                              uVar12 << 0x18);
              if (cVar2 == '\x01') {
                dVar20 = (double)(int)fVar13;
              }
              else {
                dVar20 = (double)fVar13;
              }
              if (dVar20 < *(double *)((long)&pRVar5->u + lVar16)) goto LAB_001e05d1;
            }
LAB_001e05d3:
            iVar8 = 0;
            unaff_R15D = iVar17;
            if (iVar18 == 0) {
              iVar8 = 6;
            }
          }
          else {
            lVar6 = *(long *)((long)&pRVar5->pInfo + lVar16);
            uVar3 = *(undefined4 *)(lVar6 + 0x38);
            iVar7 = *(int *)((long)&pRVar5->op + lVar16);
            local_e8 = iVar18;
            if ((iVar7 == 0x47) && (pRVar11->iLevel == '\x01')) {
              local_e0 = dVar22;
              local_b4 = iVar17;
              iVar10 = readInt64(local_c0);
              *(i64 *)(lVar6 + 0x48) = iVar10;
              pRVar11 = local_b0;
              dVar22 = local_e0;
              iVar17 = local_b4;
            }
            if (cVar2 == '\x01') {
              switch(uVar3) {
              case 10:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x30);
                local_60 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x2c);
                local_68 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 8:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x28);
                local_70 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x24);
                local_78 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 6:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x20);
                local_80 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x1c);
                local_88 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 4:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x18);
                local_90 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x14);
                local_98 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              default:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x10);
                local_a0 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0xc);
                local_a8 = (double)(int)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              }
            }
            else {
              switch(uVar3) {
              case 10:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x30);
                local_60 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x2c);
                local_68 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 8:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x28);
                local_70 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x24);
                local_78 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 6:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x20);
                local_80 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x1c);
                local_88 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              case 4:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x18);
                local_90 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x14);
                local_98 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              default:
                uVar12 = *(uint *)(puVar4 + lVar9 + 0x10);
                local_a0 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
                uVar12 = *(uint *)(puVar4 + lVar9 + 0xc);
                local_a8 = (double)(float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                           (uVar12 & 0xff00) << 8 | uVar12 << 0x18);
              }
            }
            if (iVar7 == 0x46) {
              local_cc = 0;
              iVar7 = (**(code **)((long)&pRVar5->u + lVar16))(lVar6,uVar3,&local_a8,&local_cc);
              iVar18 = local_e8;
              if (local_cc == 0) {
                iVar18 = 0;
              }
              dVar22 = 0.0;
            }
            else {
              *(double **)(lVar6 + 0x28) = &local_a8;
              *(uint *)(lVar6 + 0x3c) = pRVar11->iLevel - 1;
              RVar21 = pRVar11->rScore;
              *(RtreeDValue *)(lVar6 + 0x50) = RVar21;
              *(RtreeDValue *)(lVar6 + 0x60) = RVar21;
              bVar19 = pRVar11->eWithin;
              *(uint *)(lVar6 + 0x58) = (uint)bVar19;
              *(uint *)(lVar6 + 0x5c) = (uint)bVar19;
              local_e0 = dVar22;
              iVar7 = (**(code **)((long)&pRVar5->u + lVar16))(lVar6);
              iVar18 = local_e8;
              if (*(int *)(lVar6 + 0x5c) < local_e8) {
                iVar18 = *(int *)(lVar6 + 0x5c);
              }
              dVar22 = *(double *)(lVar6 + 0x60);
              if ((0.0 <= local_e0) && (local_e0 <= dVar22)) {
                dVar22 = local_e0;
              }
            }
            iVar8 = 1;
            pRVar11 = local_b0;
            pCur = local_d8;
            unaff_R15D = iVar7;
            if (iVar7 == 0) goto LAB_001e05d3;
          }
          if (iVar8 != 0) {
            if (iVar8 != 6) goto LAB_001e06e1;
            break;
          }
          lVar16 = lVar16 + 0x18;
          iVar17 = unaff_R15D;
        } while (local_38 != lVar16);
      }
      uVar15 = pRVar11->iCell;
      bVar19 = uVar15 + 1;
      pRVar11->iCell = bVar19;
      if (iVar18 == 0) {
        iVar8 = 4;
        pCur = local_d8;
      }
      else {
        iLevel = pRVar11->iLevel + 0xff;
        local_e8 = iVar18;
        local_e0 = dVar22;
        if (iLevel == '\0') {
          iVar10 = pRVar11->id;
        }
        else {
          iVar10 = readInt64(local_c0);
          uVar15 = '\0';
        }
        pCur = local_d8;
        if (local_e4 <= bVar19) {
          rtreeSearchPointPop(local_d8);
        }
        RVar21 = 0.0;
        if (0.0 <= local_e0) {
          RVar21 = local_e0;
        }
        pRVar11 = rtreeSearchPointNew(pCur,RVar21,iLevel);
        if (pRVar11 == (RtreeSearchPoint *)0x0) {
          unaff_R15D = 7;
          iVar8 = 1;
          pRVar11 = (RtreeSearchPoint *)0x0;
        }
        else {
          pRVar11->eWithin = (u8)local_e8;
          pRVar11->id = iVar10;
          pRVar11->iCell = uVar15;
          iVar8 = 5;
        }
      }
LAB_001e06e1:
    } while (iVar8 == 4);
    if (iVar8 != 5) {
      return unaff_R15D;
    }
LAB_001e06f4:
    local_ec = iVar7;
    if (local_e4 <= pRVar11->iCell) {
      rtreeSearchPointPop(pCur);
    }
  } while( true );
}

Assistant:

static int rtreeStepToLeaf(RtreeCursor *pCur){
  RtreeSearchPoint *p;
  Rtree *pRtree = RTREE_OF_CURSOR(pCur);
  RtreeNode *pNode;
  int eWithin;
  int rc = SQLITE_OK;
  int nCell;
  int nConstraint = pCur->nConstraint;
  int ii;
  int eInt;
  RtreeSearchPoint x;

  eInt = pRtree->eCoordType==RTREE_COORD_INT32;
  while( (p = rtreeSearchPointFirst(pCur))!=0 && p->iLevel>0 ){
    pNode = rtreeNodeOfFirstSearchPoint(pCur, &rc);
    if( rc ) return rc;
    nCell = NCELL(pNode);
    assert( nCell<200 );
    while( p->iCell<nCell ){
      sqlite3_rtree_dbl rScore = (sqlite3_rtree_dbl)-1;
      u8 *pCellData = pNode->zData + (4+pRtree->nBytesPerCell*p->iCell);
      eWithin = FULLY_WITHIN;
      for(ii=0; ii<nConstraint; ii++){
        RtreeConstraint *pConstraint = pCur->aConstraint + ii;
        if( pConstraint->op>=RTREE_MATCH ){
          rc = rtreeCallbackConstraint(pConstraint, eInt, pCellData, p,
                                       &rScore, &eWithin);
          if( rc ) return rc;
        }else if( p->iLevel==1 ){
          rtreeLeafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }else{
          rtreeNonleafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }
        if( eWithin==NOT_WITHIN ) break;
      }
      p->iCell++;
      if( eWithin==NOT_WITHIN ) continue;
      x.iLevel = p->iLevel - 1;
      if( x.iLevel ){
        x.id = readInt64(pCellData);
        x.iCell = 0;
      }else{
        x.id = p->id;
        x.iCell = p->iCell - 1;
      }
      if( p->iCell>=nCell ){
        RTREE_QUEUE_TRACE(pCur, "POP-S:");
        rtreeSearchPointPop(pCur);
      }
      if( rScore<RTREE_ZERO ) rScore = RTREE_ZERO;
      p = rtreeSearchPointNew(pCur, rScore, x.iLevel);
      if( p==0 ) return SQLITE_NOMEM;
      p->eWithin = (u8)eWithin;
      p->id = x.id;
      p->iCell = x.iCell;
      RTREE_QUEUE_TRACE(pCur, "PUSH-S:");
      break;
    }
    if( p->iCell>=nCell ){
      RTREE_QUEUE_TRACE(pCur, "POP-Se:");
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = p==0;
  return SQLITE_OK;
}